

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug-test.c++
# Opt level: O2

void __thiscall
kj::_::anon_unknown_0::MockExceptionCallback::logMessage
          (MockExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  char *__first;
  size_t sVar1;
  bool bVar2;
  char *__last;
  string *this_00;
  undefined4 uStack_48;
  int contextDepth_local;
  int line_local;
  LogSeverity severity_local;
  char *file_local;
  Array<char> local_30;
  
  local_30.ptr = "To symbolize stack traces, install it in your $PATH";
  local_30.size_ = 0x34;
  contextDepth_local = contextDepth;
  line_local = line;
  severity_local = severity;
  file_local = file;
  bVar2 = String::contains(text,(StringPtr *)&local_30);
  if (!bVar2) {
    this_00 = &this->text;
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,"log message: ");
    str<char_const*&,char_const(&)[2],int&,char_const(&)[3],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String>
              ((String *)&local_30,(kj *)&file_local,(char **)0x1bf197,(char (*) [2])&line_local,
               (int *)":+",(char (*) [3])&contextDepth_local,(int *)0x1c1f42,
               (char (*) [3])&severity_local,(LogSeverity *)0x1c1f42,(char (*) [3])text,
               (String *)CONCAT44(contextDepth_local,uStack_48));
    Array<char>::operator=(&text->content,&local_30);
    Array<char>::~Array(&local_30);
    __first = (text->content).ptr;
    sVar1 = (text->content).size_;
    __last = __first + (sVar1 - 1);
    if (sVar1 == 0) {
      __last = (char *)0x0;
      __first = (char *)0x0;
    }
    ::std::__cxx11::string::append<char*,void>((string *)this_00,__first,__last);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,"\n");
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    if (text.contains("To symbolize stack traces, install it in your $PATH")) {
      // Ignore warning about LLVM_SYMBOLIZER not being available.
      return;
    }

    this->text += "log message: ";
    text = str(file, ":", line, ":+", contextDepth, ": ", severity, ": ", mv(text));
    this->text.append(text.begin(), text.end());
    this->text.append("\n");
  }